

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

LabelInstr * __thiscall
Lowerer::GenerateBailOut
          (Lowerer *this,Instr *instr,BranchInstr *branchInstr,LabelInstr *bailOutLabel,
          LabelInstr *collectRuntimeStatsLabel)

{
  IRKind IVar1;
  OpCode OVar2;
  RegSlot resultByteCodeReg;
  uint uVar3;
  LabelInstr *this_00;
  Func *func;
  code *pcVar4;
  bool bVar5;
  byte bVar6;
  BailOutKind BVar7;
  uint32 uVar8;
  uint32 trueBailOutOffset;
  BailOutInfo *bailOutInfo;
  undefined4 *puVar9;
  MemRefOpnd *pMVar10;
  IntConstOpnd *pIVar11;
  AddrOpnd *src;
  BranchInstr *pBVar12;
  Instr *instr_00;
  BranchBailOutRecord *this_01;
  Opnd *pOVar13;
  HelperCallOpnd *this_02;
  JITTimeFunctionBody *this_03;
  LabelInstr *pLVar14;
  int bailOutRecordOffset;
  uint uVar15;
  Allocator *alloc;
  JnHelperMethod fnHelper;
  
  bailOutInfo = IR::Instr::GetBailOutInfo(instr);
  pLVar14 = (LabelInstr *)bailOutInfo->bailOutInstr;
  if ((instr->field_0x38 & 8) != 0) {
    if (pLVar14 == (LabelInstr *)instr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3761,"(bailOutInstr != instr)","bailOutInstr != instr");
      if (!bVar5) goto LAB_005ae3b0;
      *puVar9 = 0;
    }
    IVar1 = (pLVar14->super_Instr).m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar5) goto LAB_005ae3b0;
      *puVar9 = 0;
    }
    pBVar12 = IR::BranchInstr::New(JMP,pLVar14,this->m_func);
    IR::Instr::InsertBefore(instr,&pBVar12->super_Instr);
    IR::Instr::Remove(instr);
    return bailOutLabel;
  }
  if (collectRuntimeStatsLabel == (LabelInstr *)0x0) {
    collectRuntimeStatsLabel = IR::LabelInstr::New(Label,this->m_func,true);
  }
  if ((collectRuntimeStatsLabel->super_Instr).m_next != (Instr *)0x0 ||
      (collectRuntimeStatsLabel->super_Instr).m_prev != (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3770,"(!collectRuntimeStatsLabel->IsLinked())",
                       "!collectRuntimeStatsLabel->IsLinked()");
    if (!bVar5) goto LAB_005ae3b0;
    *puVar9 = 0;
  }
  IR::Instr::InsertBefore(instr,&collectRuntimeStatsLabel->super_Instr);
  if (pLVar14 != (LabelInstr *)instr) {
    pMVar10 = IR::MemRefOpnd::New(&bailOutInfo->bailOutRecord->bailOutKind,TyUint32,this->m_func,
                                  AddrOpndKindDynamicBailOutKindRef);
    BVar7 = IR::Instr::GetBailOutKind(instr);
    pIVar11 = IR::IntConstOpnd::New((ulong)BVar7,(pMVar10->super_Opnd).m_type,this->m_func,false);
    bailOutRecordOffset = 0;
    InsertMove(&pMVar10->super_Opnd,&pIVar11->super_Opnd,instr,false);
    BVar7 = IR::Instr::GetBailOutKind(instr);
    if ((BVar7 == BailOutFailedTypeCheck) ||
       (BVar7 = IR::Instr::GetBailOutKind(instr), BVar7 == BailOutFailedFixedFieldTypeCheck)) {
      if (bailOutInfo->polymorphicCacheIndex == 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bailOutRecordOffset = 0x10536e4;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3795,"(bailOutInfo->polymorphicCacheIndex != (uint)-1)",
                           "bailOutInfo->polymorphicCacheIndex != (uint)-1");
        if (!bVar5) goto LAB_005ae3b0;
        *puVar9 = 0;
      }
      if (bailOutInfo->bailOutRecord == (BailOutRecord *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bailOutRecordOffset = 0x1053730;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3796,"(bailOutInfo->bailOutRecord)","bailOutInfo->bailOutRecord");
        if (!bVar5) goto LAB_005ae3b0;
        *puVar9 = 0;
      }
      InsertMoveForPolymorphicCacheIndex
                (this,instr,bailOutInfo,bailOutRecordOffset,bailOutInfo->polymorphicCacheIndex);
    }
    if ((bailOutInfo->bailOutRecord->type & ~Branch) == Shared) {
      BVar7 = IR::Instr::GetBailOutKind(instr);
      if ((BVar7 != BailOutFailedTypeCheck) &&
         (BVar7 = IR::Instr::GetBailOutKind(instr), BVar7 != BailOutFailedFixedFieldTypeCheck)) {
        InsertMoveForPolymorphicCacheIndex(this,instr,bailOutInfo,bailOutRecordOffset,0xffffffff);
      }
      pMVar10 = IR::MemRefOpnd::New(bailOutInfo->bailOutRecord + 1,TyUint64,this->m_func,
                                    AddrOpndKindDynamicMisc);
      src = CreateFunctionBodyOpnd(this,instr->m_func);
      InsertMove(&pMVar10->super_Opnd,&src->super_Opnd,instr,false);
    }
    IVar1 = (pLVar14->super_Instr).m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar5) goto LAB_005ae3b0;
      *puVar9 = 0;
    }
    if ((pLVar14->field_0x78 & 0x20) != 0) {
      collectRuntimeStatsLabel->field_0x78 = collectRuntimeStatsLabel->field_0x78 | 0x20;
    }
    if (pLVar14 != bailOutLabel && bailOutLabel != (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x37ba,"(bailOutLabel == nullptr || bailOutLabel == bailOutTargetLabel)",
                         "bailOutLabel == nullptr || bailOutLabel == bailOutTargetLabel");
      if (!bVar5) goto LAB_005ae3b0;
      *puVar9 = 0;
    }
    pBVar12 = IR::BranchInstr::New(JMP,pLVar14,this->m_func);
    IR::Instr::InsertAfter(instr,&pBVar12->super_Instr);
    IR::Instr::Remove(instr);
    return collectRuntimeStatsLabel;
  }
  IVar1 = (pLVar14->super_Instr).m_kind;
  if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x37c3,"(!bailOutInstr->IsLabelInstr())","!bailOutInstr->IsLabelInstr()");
    if (!bVar5) goto LAB_005ae3b0;
    *puVar9 = 0;
  }
  if (bailOutLabel == (LabelInstr *)0x0) {
    bailOutLabel = (LabelInstr *)instr->m_prev;
    IVar1 = (bailOutLabel->super_Instr).m_kind;
    if ((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel)) {
      bailOutLabel = IR::LabelInstr::New(Label,this->m_func,true);
      goto LAB_005add23;
    }
    if ((bailOutLabel->field_0x78 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x37cc,"(bailOutLabel->isOpHelper)","bailOutLabel->isOpHelper");
      if (!bVar5) goto LAB_005ae3b0;
      *puVar9 = 0;
    }
  }
  else {
LAB_005add23:
    IR::Instr::InsertBefore(instr,&bailOutLabel->super_Instr);
  }
  (bailOutLabel->super_Instr).m_noLazyHelperAssert = true;
  BVar7 = IR::Instr::GetBailOutKind((Instr *)pLVar14);
  OVar2 = (pLVar14->super_Instr).m_opcode;
  uVar15 = OVar2 - 0x237;
  if ((((uVar15 < 9) && ((0x103U >> (uVar15 & 0x1f) & 1) != 0)) || (OVar2 == Yield)) ||
     ((BVar7 & (BailOutOnArrayAccessHelperCall|BailOutConventionalNativeArrayAccessOnly|
               BailOutConventionalTypedArrayAccessOnly)) != BailOutInvalid)) {
    bailOutLabel->field_0x78 = bailOutLabel->field_0x78 | 0x20;
  }
  bailOutInfo->bailOutInstr = &bailOutLabel->super_Instr;
  bailOutLabel->field_0x78 = bailOutLabel->field_0x78 | 4;
  if (bailOutInfo->bailOutRecord != (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x37f0,"(bailOutInfo->bailOutRecord == nullptr)",
                       "bailOutInfo->bailOutRecord == nullptr");
    if (!bVar5) goto LAB_005ae3b0;
    *puVar9 = 0;
  }
  if (branchInstr == (BranchInstr *)0x0) {
    BVar7 = IR::Instr::GetBailOutKind((Instr *)pLVar14);
    alloc = &this->m_func->topFunc->nativeCodeDataAllocator;
    if (BVar7 == BailOutShared) {
      this_01 = (BranchBailOutRecord *)
                new<NativeCodeData::AllocatorT<SharedBailOutRecord>>
                          (0x68,(AllocatorT<SharedBailOutRecord> *)alloc,0x5f5f22);
      uVar8 = bailOutInfo->bailOutOffset;
      uVar3 = bailOutInfo->polymorphicCacheIndex;
      BVar7 = IR::Instr::GetBailOutKind(instr);
      SharedBailOutRecord::SharedBailOutRecord
                ((SharedBailOutRecord *)this_01,uVar8,uVar3,BVar7,bailOutInfo->bailOutFunc);
      fnHelper = HelperSaveAllRegistersAndBailOut;
      if (bailOutInfo->isLoopTopBailOutInfo == true) {
        (this_01->super_BailOutRecord).type = SharedForLoopTop;
      }
    }
    else {
      this_01 = (BranchBailOutRecord *)
                new<NativeCodeData::AllocatorT<BailOutRecord>>
                          (0x60,(AllocatorT<BailOutRecord> *)alloc,0x5936a8);
      uVar8 = bailOutInfo->bailOutOffset;
      uVar3 = bailOutInfo->polymorphicCacheIndex;
      BVar7 = IR::Instr::GetBailOutKind(instr);
      BailOutRecord::BailOutRecord
                ((BailOutRecord *)this_01,uVar8,uVar3,BVar7,bailOutInfo->bailOutFunc);
      fnHelper = HelperSaveAllRegistersAndBailOut;
    }
  }
  else {
    if ((branchInstr->super_Instr).m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x37f5,"(branchInstr->GetSrc2() == nullptr)",
                         "branchInstr->GetSrc2() == nullptr");
      if (!bVar5) goto LAB_005ae3b0;
      *puVar9 = 0;
    }
    if ((branchInstr->super_Instr).m_dst != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x37f6,"(branchInstr->GetDst() == nullptr)",
                         "branchInstr->GetDst() == nullptr");
      if (!bVar5) goto LAB_005ae3b0;
      *puVar9 = 0;
    }
    this_00 = branchInstr->m_branchTarget;
    uVar8 = IR::Instr::GetByteCodeOffset(&this_00->super_Instr);
    if (uVar8 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x37f9,
                         "(targetLabel->GetByteCodeOffset() != Js::Constants::NoByteCodeOffset)",
                         "targetLabel->GetByteCodeOffset() != Js::Constants::NoByteCodeOffset");
      if (!bVar5) goto LAB_005ae3b0;
      *puVar9 = 0;
    }
    OVar2 = (branchInstr->super_Instr).m_opcode;
    bVar5 = OVar2 == BrFalse_A;
    if (bailOutInfo->isInvertedBranch == true) {
      bVar5 = OVar2 != BrFalse_A;
      pOVar13 = (branchInstr->super_Instr).m_src1;
      pIVar11 = IR::IntConstOpnd::New(1,TyInt64,instr->m_func,false);
      instr_00 = IR::Instr::New(Sub_I4,pOVar13,pOVar13,&pIVar11->super_Opnd,instr->m_func);
      IR::Instr::InsertBefore(instr,instr_00);
      LowererMD::EmitInt4Instr(instr_00);
    }
    trueBailOutOffset = IR::Instr::GetByteCodeOffset(&this_00->super_Instr);
    uVar8 = bailOutInfo->bailOutOffset;
    if (bVar5) {
      uVar8 = trueBailOutOffset;
      trueBailOutOffset = bailOutInfo->bailOutOffset;
    }
    this_01 = (BranchBailOutRecord *)
              new<NativeCodeData::AllocatorT<BranchBailOutRecord>>
                        (0x68,(AllocatorT<BranchBailOutRecord> *)
                              &this->m_func->topFunc->nativeCodeDataAllocator,0x5f5daa);
    resultByteCodeReg = branchInstr->m_byteCodeReg;
    BVar7 = IR::Instr::GetBailOutKind(instr);
    BranchBailOutRecord::BranchBailOutRecord
              (this_01,trueBailOutOffset,uVar8,resultByteCodeReg,BVar7,bailOutInfo->bailOutFunc);
    pOVar13 = IR::Opnd::Copy((branchInstr->super_Instr).m_src1,(branchInstr->super_Instr).m_func);
    bailOutInfo->branchConditionOpnd = pOVar13;
    fnHelper = HelperSaveAllRegistersAndBranchBailOut;
  }
  bailOutInfo->bailOutRecord = &this_01->super_BailOutRecord;
  (this_01->super_BailOutRecord).bailOutOpcode = bailOutInfo->bailOutOpcode;
  if ((instr->m_opcode == BailOnNotStackArgs) && (instr->m_src1 != (Opnd *)0x0)) {
    IR::Instr::FreeSrc1(instr);
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    IR::Instr::FreeSrc2(instr);
  }
  bVar5 = IR::Instr::HasLazyBailOut(instr);
  if ((bVar5) && (IR::Instr::ClearLazyBailOut(instr), (instr->field_0x38 & 0x10) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3858,"(instr->HasBailOutInfo())","instr->HasBailOutInfo()");
    if (!bVar5) goto LAB_005ae3b0;
    *puVar9 = 0;
  }
  instr->m_opcode = Call;
  if (instr->m_dst != (Opnd *)0x0) {
    IR::Instr::FreeDst(instr);
  }
  this_02 = IR::HelperCallOpnd::New(fnHelper,this->m_func);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_005ae3b0;
    *puVar9 = 0;
  }
  func = instr->m_func;
  if ((this_02->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) {
LAB_005ae3b0:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  bVar6 = (this_02->super_Opnd).field_0xb;
  if ((bVar6 & 2) != 0) {
    this_02 = (HelperCallOpnd *)IR::Opnd::Copy(&this_02->super_Opnd,func);
    bVar6 = (this_02->super_Opnd).field_0xb;
  }
  (this_02->super_Opnd).field_0xb = bVar6 | 2;
  instr->m_src1 = &this_02->super_Opnd;
  LowererMD::LowerCall(&this->m_lowererMD,instr,0);
  this_03 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar5 = JITTimeFunctionBody::IsCoroutine(this_03);
  if (bVar5) {
    BVar7 = IR::Instr::GetBailOutKind((Instr *)pLVar14);
    if (BVar7 != BailOutForGeneratorYield) {
      LowerGeneratorHelper::EnsureEpilogueLabels(&this->m_lowerGeneratorHelper);
      GenerateJumpToEpilogForBailOut
                (this,bailOutInfo,instr,(this->m_lowerGeneratorHelper).epilogueForBailOut);
    }
  }
  else {
    pLVar14 = EnsureEpilogueLabel(this);
    GenerateJumpToEpilogForBailOut(this,bailOutInfo,instr,pLVar14);
  }
  return collectRuntimeStatsLabel;
}

Assistant:

IR::LabelInstr *
Lowerer::GenerateBailOut(IR::Instr * instr, IR::BranchInstr * branchInstr, IR::LabelInstr *bailOutLabel, IR::LabelInstr * collectRuntimeStatsLabel)
{
    BailOutInfo * bailOutInfo = instr->GetBailOutInfo();
    IR::Instr * bailOutInstr = bailOutInfo->bailOutInstr;
    if (instr->IsCloned())
    {
        Assert(bailOutInstr != instr);

        // Jump to the cloned bail out label
        IR::LabelInstr * bailOutLabelInstr = bailOutInstr->AsLabelInstr();
        IR::BranchInstr * bailOutBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, bailOutLabelInstr, this->m_func);
        instr->InsertBefore(bailOutBranch);
        instr->Remove();
        return bailOutLabel;
    }

    // Add helper label to trigger layout.
    if (!collectRuntimeStatsLabel)
    {
        collectRuntimeStatsLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    }
    Assert(!collectRuntimeStatsLabel->IsLinked());
    instr->InsertBefore(collectRuntimeStatsLabel);

    if (bailOutInstr != instr)
    {
        // this bailOutInfo is shared, just jump to the bailout target

        IR::Opnd * indexOpndForBailOutKind = nullptr;

        int bailOutRecordOffset = 0;
        if (this->m_func->IsOOPJIT())
        {
            bailOutRecordOffset = NativeCodeData::GetDataTotalOffset(bailOutInfo->bailOutRecord);

            indexOpndForBailOutKind = IR::IndirOpnd::New(IR::RegOpnd::New(m_func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), (int)(bailOutRecordOffset + BailOutRecord::GetOffsetOfBailOutKind()), TyUint32,
#if DBG
                NativeCodeData::GetDataDescription(bailOutInfo->bailOutRecord, this->m_func->m_alloc),
#endif
                m_func, true);

            this->addToLiveOnBackEdgeSyms->Set(m_func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            indexOpndForBailOutKind =
                IR::MemRefOpnd::New((BYTE*)bailOutInfo->bailOutRecord + BailOutRecord::GetOffsetOfBailOutKind(), TyUint32, this->m_func, IR::AddrOpndKindDynamicBailOutKindRef);
        }

        InsertMove(
            indexOpndForBailOutKind, IR::IntConstOpnd::New(instr->GetBailOutKind(), indexOpndForBailOutKind->GetType(), this->m_func), instr, false);

        // No point in doing this for BailOutFailedEquivalentTypeCheck or BailOutFailedEquivalentFixedFieldTypeCheck,
        // because the respective inline cache is already polymorphic, anyway.
        if (instr->GetBailOutKind() == IR::BailOutFailedTypeCheck || instr->GetBailOutKind() == IR::BailOutFailedFixedFieldTypeCheck)
        {
            // We have a type check bailout that shares a bailout record with other instructions.
            // Generate code to write the cache index into the bailout record before we jump to the call site.
            Assert(bailOutInfo->polymorphicCacheIndex != (uint)-1);
            Assert(bailOutInfo->bailOutRecord);
            InsertMoveForPolymorphicCacheIndex(instr, bailOutInfo, bailOutRecordOffset, bailOutInfo->polymorphicCacheIndex);
        }

        if (bailOutInfo->bailOutRecord->IsShared())
        {
            // The polymorphicCacheIndex value should be relevant only for field type check bailouts.
            // In case of a shared bailout record, the polymorphicCacheIndex sticks regardless of the bailout kind being different
            // from field type check. Therefore, it results in an out-of-bound write while trying to recrod a field access update.
            if (instr->GetBailOutKind() != IR::BailOutFailedTypeCheck && instr->GetBailOutKind() != IR::BailOutFailedFixedFieldTypeCheck)
            {
                InsertMoveForPolymorphicCacheIndex(instr, bailOutInfo, bailOutRecordOffset, (uint)-1);
            }

            IR::Opnd *functionBodyOpnd;
            if (this->m_func->IsOOPJIT())
            {
                functionBodyOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(m_func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), (int)(bailOutRecordOffset + SharedBailOutRecord::GetOffsetOfFunctionBody()), TyMachPtr, m_func);
            }
            else
            {
                functionBodyOpnd = IR::MemRefOpnd::New((BYTE*)bailOutInfo->bailOutRecord + SharedBailOutRecord::GetOffsetOfFunctionBody(), TyMachPtr, this->m_func);
            }
            InsertMove(
                functionBodyOpnd, CreateFunctionBodyOpnd(instr->m_func), instr, false);
        }

        // GenerateBailOut should have replaced this as a label as we should have already lowered
        // the main bailOutInstr.
        IR::LabelInstr * bailOutTargetLabel = bailOutInstr->AsLabelInstr();
#if DBG
        if (bailOutTargetLabel->m_noHelperAssert)
        {
            collectRuntimeStatsLabel->m_noHelperAssert = true;
        }
#endif
        Assert(bailOutLabel == nullptr || bailOutLabel == bailOutTargetLabel);

        IR::BranchInstr * newBranchInstr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, bailOutTargetLabel, this->m_func);
        instr->InsertAfter(newBranchInstr);
        instr->Remove();
        return collectRuntimeStatsLabel ? collectRuntimeStatsLabel : bailOutLabel;
    }

    // The bailout hasn't been generated yet.
    Assert(!bailOutInstr->IsLabelInstr());

    // Capture the condition for this bailout
    if (bailOutLabel == nullptr)
    {
        // Create a label and place it in the bailout info so that shared bailout point can jump to this one
        if (instr->m_prev->IsLabelInstr())
        {
            bailOutLabel = instr->m_prev->AsLabelInstr();
            Assert(bailOutLabel->isOpHelper);
        }
        else
        {
            bailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
            instr->InsertBefore(bailOutLabel);
        }
    }
    else
    {
        instr->InsertBefore(bailOutLabel);
    }

#if DBG
    bailOutLabel->m_noLazyHelperAssert = true;
#endif

#if DBG
    const IR::BailOutKind bailOutKind = bailOutInstr->GetBailOutKind();

    if (bailOutInstr->m_opcode == Js::OpCode::BailOnNoSimdTypeSpec ||
        bailOutInstr->m_opcode == Js::OpCode::BailOnNoProfile ||
        bailOutInstr->m_opcode == Js::OpCode::BailOnException ||
        bailOutInstr->m_opcode == Js::OpCode::Yield ||
        bailOutKind & (IR::BailOutConventionalTypedArrayAccessOnly |
                       IR::BailOutConventionalNativeArrayAccessOnly |
                       IR::BailOutOnArrayAccessHelperCall))
    {
        bailOutLabel->m_noHelperAssert = true;
    }
#endif

    bailOutInfo->bailOutInstr = bailOutLabel;
    bailOutLabel->m_hasNonBranchRef = true;

    // Create the bail out record
    Assert(bailOutInfo->bailOutRecord == nullptr);
    BailOutRecord * bailOutRecord;
    IR::JnHelperMethod helperMethod;
    if (branchInstr != nullptr)
    {
        Assert(branchInstr->GetSrc2() == nullptr);
        Assert(branchInstr->GetDst() == nullptr);

        IR::LabelInstr * targetLabel = branchInstr->GetTarget();
        Assert(targetLabel->GetByteCodeOffset() != Js::Constants::NoByteCodeOffset);

        uint32 trueOffset;
        uint32 falseOffset;
        IR::Opnd *condOpnd = branchInstr->GetSrc1();
        bool invertTarget = (branchInstr->m_opcode == Js::OpCode::BrFalse_A);

        if (bailOutInfo->isInvertedBranch)
        {
            // Flip the condition
            IR::Instr *subInstr = IR::Instr::New(Js::OpCode::Sub_I4, condOpnd, condOpnd, IR::IntConstOpnd::New(1, TyMachReg, instr->m_func), instr->m_func);
            instr->InsertBefore(subInstr);
            this->m_lowererMD.EmitInt4Instr(subInstr);
            // We should really do a DEC/NEG for a full 2's complement flip from 0/1 to 1/0,
            // but DEC is sufficient to flip from 0/1 to -1/0, which is false/true to true/false...
            // instr->InsertBefore(IR::Instr::New(Js::OpCode::Neg_I4, condOpnd, condOpnd, instr->m_func));

            invertTarget = invertTarget ? false : true;
        }

        if (!invertTarget)
        {
            trueOffset = targetLabel->GetByteCodeOffset();
            falseOffset = bailOutInfo->bailOutOffset;
        }
        else
        {
            falseOffset = targetLabel->GetByteCodeOffset();
            trueOffset = bailOutInfo->bailOutOffset;
        }

        bailOutRecord = NativeCodeDataNewZ(this->m_func->GetNativeCodeDataAllocator(),
            BranchBailOutRecord, trueOffset, falseOffset, branchInstr->GetByteCodeReg(), instr->GetBailOutKind(), bailOutInfo->bailOutFunc);

        helperMethod = IR::HelperSaveAllRegistersAndBranchBailOut;
#ifdef _M_IX86
        if(!AutoSystemInfo::Data.SSE2Available())
        {
            helperMethod = IR::HelperSaveAllRegistersNoSse2AndBranchBailOut;
        }
#endif

        // Save the condition. The register allocator will generate arguments.
        bailOutInfo->branchConditionOpnd = branchInstr->GetSrc1()->Copy(branchInstr->m_func);
    }
    else
    {
        if (bailOutInstr->GetBailOutKind() == IR::BailOutShared)
        {
            bailOutRecord = NativeCodeDataNewZ(this->m_func->GetNativeCodeDataAllocator(),
                SharedBailOutRecord, bailOutInfo->bailOutOffset, bailOutInfo->polymorphicCacheIndex, instr->GetBailOutKind(), bailOutInfo->bailOutFunc);
            if (bailOutInfo->isLoopTopBailOutInfo)
            {
                bailOutRecord->SetType(BailOutRecord::BailoutRecordType::SharedForLoopTop);
            }
        }
        else
        {
            bailOutRecord = NativeCodeDataNewZ(this->m_func->GetNativeCodeDataAllocator(),
                BailOutRecord, bailOutInfo->bailOutOffset, bailOutInfo->polymorphicCacheIndex, instr->GetBailOutKind(), bailOutInfo->bailOutFunc);
        }

        helperMethod = IR::HelperSaveAllRegistersAndBailOut;
#ifdef _M_IX86
        if(!AutoSystemInfo::Data.SSE2Available())
        {
            helperMethod = IR::HelperSaveAllRegistersNoSse2AndBailOut;
        }
#endif
    }

    // Save the bailout record. The register allocator will generate arguments.
    bailOutInfo->bailOutRecord = bailOutRecord;

#if ENABLE_DEBUG_CONFIG_OPTIONS
    bailOutRecord->bailOutOpcode = bailOutInfo->bailOutOpcode;
#endif

    if (instr->m_opcode == Js::OpCode::BailOnNotStackArgs && instr->GetSrc1())
    {
        // src1 on BailOnNotStackArgs is helping CSE
        instr->FreeSrc1();
    }

    if (instr->GetSrc2() != nullptr)
    {
        // Ideally we should never be in this situation but incase we reached a
        // condition where we didn't free src2, free it here.
        instr->FreeSrc2();
    }

    // We do not need lazybailout bit on SaveAllRegistersAndBailOut
    if (instr->HasLazyBailOut())
    {
        instr->ClearLazyBailOut();
        Assert(instr->HasBailOutInfo());
    }

    // Call the bail out wrapper
    instr->m_opcode = Js::OpCode::Call;
    if(instr->GetDst())
    {
        // To facilitate register allocation, don't assign a destination. The result will anyway go into the return register,
        // but the register allocator does not need to kill that register for the call.
        instr->FreeDst();
    }
    instr->SetSrc1(IR::HelperCallOpnd::New(helperMethod, this->m_func));
    m_lowererMD.LowerCall(instr, 0);

    if (this->m_func->GetJITFunctionBody()->IsCoroutine())
    {
        if (bailOutInstr->GetBailOutKind() != IR::BailOutForGeneratorYield)
        {
            // Defer introducing the JMP to epilog until LowerPrologEpilog phase for Yield bailouts so
            // that Yield does not appear to have flow out of its containing block for the RegAlloc phase.
            // Yield is an unconditional bailout but we want to simulate the flow as if the Yield were
            // just like a call.
            GenerateJumpToEpilogForBailOut(bailOutInfo, instr, this->m_lowerGeneratorHelper.GetEpilogueForBailOut());
        }
    }
    else
    {
        GenerateJumpToEpilogForBailOut(bailOutInfo, instr, this->EnsureEpilogueLabel());
    }



    return collectRuntimeStatsLabel ? collectRuntimeStatsLabel : bailOutLabel;
}